

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O1

RK_S32 compare_sps(HEVCSPS *openhevc_sps,HEVCSPS *sps)

{
  char *fmt;
  
  if (openhevc_sps->vps_id == sps->vps_id) {
    if (openhevc_sps->sps_id == sps->sps_id) {
      if (openhevc_sps->chroma_format_idc == sps->chroma_format_idc) {
        if (openhevc_sps->separate_colour_plane_flag == sps->separate_colour_plane_flag) {
          if (openhevc_sps->output_width == sps->output_width) {
            if (openhevc_sps->output_height == sps->output_height) {
              if (openhevc_sps->bit_depth == sps->bit_depth) {
                if (openhevc_sps->bit_depth_chroma == sps->bit_depth_chroma) {
                  if (openhevc_sps->pixel_shift == sps->pixel_shift) {
                    if (openhevc_sps->log2_max_poc_lsb == sps->log2_max_poc_lsb) {
                      if (openhevc_sps->pcm_enabled_flag == sps->pcm_enabled_flag) {
                        if (openhevc_sps->max_sub_layers == sps->max_sub_layers) {
                          if (openhevc_sps->scaling_list_enable_flag ==
                              sps->scaling_list_enable_flag) {
                            if (openhevc_sps->nb_st_rps == sps->nb_st_rps) {
                              if (openhevc_sps->amp_enabled_flag != sps->amp_enabled_flag) {
                                _mpp_log_l(4,"H265PARSER_PS",
                                           " amp_enabled_flag diff openhevc %d != %d\n",(char *)0x0)
                                ;
                                return -1;
                              }
                              if (openhevc_sps->sao_enabled == sps->sao_enabled) {
                                if (openhevc_sps->long_term_ref_pics_present_flag ==
                                    sps->long_term_ref_pics_present_flag) {
                                  if (openhevc_sps->num_long_term_ref_pics_sps ==
                                      sps->num_long_term_ref_pics_sps) {
                                    if (openhevc_sps->sps_temporal_mvp_enabled_flag ==
                                        sps->sps_temporal_mvp_enabled_flag) {
                                      if (openhevc_sps->sps_strong_intra_smoothing_enable_flag ==
                                          sps->sps_strong_intra_smoothing_enable_flag) {
                                        if (openhevc_sps->log2_min_cb_size == sps->log2_min_cb_size)
                                        {
                                          if (openhevc_sps->log2_diff_max_min_coding_block_size ==
                                              sps->log2_diff_max_min_coding_block_size) {
                                            if (openhevc_sps->log2_min_tb_size ==
                                                sps->log2_min_tb_size) {
                                              if (openhevc_sps->log2_max_trafo_size ==
                                                  sps->log2_max_trafo_size) {
                                                if (openhevc_sps->log2_ctb_size ==
                                                    sps->log2_ctb_size) {
                                                  if (openhevc_sps->log2_min_pu_size ==
                                                      sps->log2_min_pu_size) {
                                                    if (openhevc_sps->
                                                        max_transform_hierarchy_depth_inter ==
                                                        sps->max_transform_hierarchy_depth_inter) {
                                                      if (openhevc_sps->
                                                          max_transform_hierarchy_depth_intra ==
                                                          sps->max_transform_hierarchy_depth_intra)
                                                      {
                                                        if (openhevc_sps->width == sps->width) {
                                                          if (openhevc_sps->height == sps->height) {
                                                            if (openhevc_sps->ctb_width ==
                                                                sps->ctb_width) {
                                                              if (openhevc_sps->ctb_height ==
                                                                  sps->ctb_height) {
                                                                if (openhevc_sps->ctb_size ==
                                                                    sps->ctb_size) {
                                                                  if (openhevc_sps->min_cb_width ==
                                                                      sps->min_cb_width) {
                                                                    if (openhevc_sps->min_cb_height
                                                                        == sps->min_cb_height) {
                                                                      if (openhevc_sps->min_tb_width
                                                                          == sps->min_tb_width) {
                                                                        if (openhevc_sps->
                                                                            min_tb_height ==
                                                                            sps->min_tb_height) {
                                                                          if (openhevc_sps->
                                                                              min_pu_width ==
                                                                              sps->min_pu_width) {
                                                                            if (openhevc_sps->
                                                                                min_pu_height ==
                                                                                sps->min_pu_height)
                                                                            {
                                                                              if (openhevc_sps->
                                                                                  qp_bd_offset ==
                                                                                  sps->qp_bd_offset)
                                                                              {
                                                                                return 0;
                                                                              }
                                                                              fmt = 
                                                  "qp_bd_offset diff \n";
                                                  }
                                                  else {
                                                    fmt = "min_pu_height diff\n";
                                                  }
                                                  }
                                                  else {
                                                    fmt = "min_pu_width diff\n";
                                                  }
                                                  }
                                                  else {
                                                    fmt = "min_tb_height diff\n";
                                                  }
                                                  }
                                                  else {
                                                    fmt = "min_tb_width diff\n";
                                                  }
                                                  }
                                                  else {
                                                    fmt = "min_cb_height diff\n";
                                                  }
                                                  }
                                                  else {
                                                    fmt = "min_cb_width diff\n";
                                                  }
                                                  }
                                                  else {
                                                    fmt = "ctb_size diff\n";
                                                  }
                                                  }
                                                  else {
                                                    fmt = "ctb_height diff\n";
                                                  }
                                                  }
                                                  else {
                                                    fmt = "ctb_width diff\n";
                                                  }
                                                  }
                                                  else {
                                                    fmt = "height diff\n";
                                                  }
                                                  }
                                                  else {
                                                    fmt = "width diff\n";
                                                  }
                                                  }
                                                  else {
                                                    fmt = 
                                                  "max_transform_hierarchy_depth_intra diff\n";
                                                  }
                                                  }
                                                  else {
                                                    fmt = 
                                                  "max_transform_hierarchy_depth_inter diff\n";
                                                  }
                                                  }
                                                  else {
                                                    fmt = "log2_min_pu_size diff\n";
                                                  }
                                                }
                                                else {
                                                  fmt = "log2_ctb_size diff\n";
                                                }
                                              }
                                              else {
                                                fmt = "log2_max_trafo_size diff\n";
                                              }
                                            }
                                            else {
                                              fmt = "log2_min_tb_size diff\n";
                                            }
                                          }
                                          else {
                                            fmt = "log2_diff_max_min_coding_block_size diff\n";
                                          }
                                        }
                                        else {
                                          fmt = "log2_min_cb_size diff\n";
                                        }
                                      }
                                      else {
                                        fmt = "sps_strong_intra_smoothing_enable_flag diff\n";
                                      }
                                    }
                                    else {
                                      fmt = "sps_temporal_mvp_enabled_flag diff\n";
                                    }
                                  }
                                  else {
                                    fmt = "num_long_term_ref_pics_sps diff\n";
                                  }
                                }
                                else {
                                  fmt = "long_term_ref_pics_present_flag diff\n";
                                }
                              }
                              else {
                                fmt = "sao_enabled diff\n";
                              }
                            }
                            else {
                              fmt = "nb_st_rps diff\n";
                            }
                          }
                          else {
                            fmt = "scaling_list_enable_flag diff\n";
                          }
                        }
                        else {
                          fmt = "max_sub_layers diff\n";
                        }
                      }
                      else {
                        fmt = "pcm_enabled_flag diff\n";
                      }
                    }
                    else {
                      fmt = "log2_max_poc_lsb diff\n";
                    }
                  }
                  else {
                    fmt = "pixel_shift diff\n";
                  }
                }
                else {
                  fmt = "bit_depth_chroma diff\n";
                }
              }
              else {
                fmt = "bit_depth diff\n";
              }
            }
            else {
              fmt = "output_height diff\n";
            }
          }
          else {
            fmt = "output_width diff\n";
          }
        }
        else {
          fmt = "separate_colour_plane_flag diff\n";
        }
      }
      else {
        fmt = "chroma_format_idc diff\n";
      }
    }
    else {
      fmt = "sps_id diff\n";
    }
  }
  else {
    fmt = "vps_id diff\n";
  }
  _mpp_log_l(4,"H265PARSER_PS",fmt,(char *)0x0);
  return -1;
}

Assistant:

static RK_S32 compare_sps(HEVCSPS *openhevc_sps, HEVCSPS *sps)
{
    if (openhevc_sps->vps_id != sps->vps_id) {
        mpp_log("vps_id diff\n");
        return -1;
    }
    if (openhevc_sps->sps_id != sps->sps_id) {
        mpp_log("sps_id diff\n");
        return -1;
    }
    if (openhevc_sps->chroma_format_idc != sps->chroma_format_idc) {
        mpp_log("chroma_format_idc diff\n");
        return -1;
    }
    if (openhevc_sps->separate_colour_plane_flag
        != sps->separate_colour_plane_flag) {
        mpp_log("separate_colour_plane_flag diff\n");
        return -1;
    }

    if (openhevc_sps->output_width != sps->output_width) {
        mpp_log("output_width diff\n");
        return -1;
    }
    if (openhevc_sps->output_height != sps->output_height) {
        mpp_log("output_height diff\n");
        return -1;
    }

    if (openhevc_sps->bit_depth != sps->bit_depth) {
        mpp_log("bit_depth diff\n");
        return -1;
    }
    if (openhevc_sps->bit_depth_chroma != sps->bit_depth_chroma) {
        mpp_log("bit_depth_chroma diff\n");
        return -1;
    }
    if (openhevc_sps->pixel_shift != sps->pixel_shift) {
        mpp_log("pixel_shift diff\n");
        return -1;
    }
    // openhevc_sps->pix_fmt;

    if (openhevc_sps->log2_max_poc_lsb != sps->log2_max_poc_lsb) {
        mpp_log("log2_max_poc_lsb diff\n");
        return -1;
    }
    if (openhevc_sps->pcm_enabled_flag != sps->pcm_enabled_flag) {
        mpp_log("pcm_enabled_flag diff\n");
        return -1;
    }

    if (openhevc_sps->max_sub_layers != sps->max_sub_layers) {
        mpp_log("max_sub_layers diff\n");
        return -1;
    }

    if (openhevc_sps->scaling_list_enable_flag != sps->scaling_list_enable_flag) {
        mpp_log("scaling_list_enable_flag diff\n");
        return -1;
    }

    if (openhevc_sps->nb_st_rps != sps->nb_st_rps) {
        mpp_log("nb_st_rps diff\n");
        return -1;
    }

    if (openhevc_sps->amp_enabled_flag != sps->amp_enabled_flag) {
        mpp_log(" amp_enabled_flag diff openhevc %d != %d\n", openhevc_sps->amp_enabled_flag, sps->amp_enabled_flag);
        return -1;
    }
    if (openhevc_sps->sao_enabled != sps->sao_enabled) {
        mpp_log("sao_enabled diff\n");
        return -1;
    }

    if (openhevc_sps->long_term_ref_pics_present_flag
        != sps->long_term_ref_pics_present_flag) {
        mpp_log("long_term_ref_pics_present_flag diff\n");
        return -1;
    }
    if (openhevc_sps->num_long_term_ref_pics_sps !=
        sps->num_long_term_ref_pics_sps) {
        mpp_log("num_long_term_ref_pics_sps diff\n");
        return -1;
    }

    if (openhevc_sps->sps_temporal_mvp_enabled_flag !=
        sps->sps_temporal_mvp_enabled_flag) {
        mpp_log("sps_temporal_mvp_enabled_flag diff\n");
        return -1;
    }
    if (openhevc_sps->sps_strong_intra_smoothing_enable_flag !=
        sps->sps_strong_intra_smoothing_enable_flag) {
        mpp_log("sps_strong_intra_smoothing_enable_flag diff\n");
        return -1;
    }

    if (openhevc_sps->log2_min_cb_size != sps->log2_min_cb_size) {
        mpp_log("log2_min_cb_size diff\n");
        return -1;
    }
    if (openhevc_sps->log2_diff_max_min_coding_block_size !=
        sps->log2_diff_max_min_coding_block_size) {
        mpp_log("log2_diff_max_min_coding_block_size diff\n");
        return -1;
    }
    if (openhevc_sps->log2_min_tb_size != sps->log2_min_tb_size) {
        mpp_log("log2_min_tb_size diff\n");
        return -1;
    }
    if (openhevc_sps->log2_max_trafo_size != sps->log2_max_trafo_size) {
        mpp_log("log2_max_trafo_size diff\n");
        return -1;
    }
    if (openhevc_sps->log2_ctb_size != sps->log2_ctb_size) {
        mpp_log("log2_ctb_size diff\n");
        return -1;
    }
    if (openhevc_sps->log2_min_pu_size != sps->log2_min_pu_size) {
        mpp_log("log2_min_pu_size diff\n");
        return -1;
    }

    if (openhevc_sps->max_transform_hierarchy_depth_inter !=
        sps->max_transform_hierarchy_depth_inter) {
        mpp_log("max_transform_hierarchy_depth_inter diff\n");
        return -1;
    }
    if (openhevc_sps->max_transform_hierarchy_depth_intra !=
        sps->max_transform_hierarchy_depth_intra) {
        mpp_log("max_transform_hierarchy_depth_intra diff\n");
        return -1;
    }

    if (openhevc_sps->width != sps->width) {
        mpp_log("width diff\n");
        return -1;
    }

    if (openhevc_sps->height != sps->height) {
        mpp_log("height diff\n");
        return -1;
    }

    if (openhevc_sps->ctb_width != sps->ctb_width) {
        mpp_log("ctb_width diff\n");
        return -1;
    }

    if ( openhevc_sps->ctb_height != sps->ctb_height) {
        mpp_log("ctb_height diff\n");
        return -1;
    }

    if (openhevc_sps->ctb_size != sps->ctb_size) {
        mpp_log("ctb_size diff\n");
        return -1;
    }

    if (openhevc_sps->min_cb_width != sps->min_cb_width) {
        mpp_log("min_cb_width diff\n");
        return -1;
    }

    if (openhevc_sps->min_cb_height != sps->min_cb_height) {
        mpp_log("min_cb_height diff\n");
        return -1;
    }

    if (openhevc_sps->min_tb_width != sps->min_tb_width) {
        mpp_log("min_tb_width diff\n");
        return -1;
    }

    if (openhevc_sps->min_tb_height != sps->min_tb_height) {
        mpp_log("min_tb_height diff\n");
        return -1;
    }

    if (openhevc_sps->min_pu_width != sps->min_pu_width) {
        mpp_log("min_pu_width diff\n");
        return -1;
    }

    if (openhevc_sps->min_pu_height != sps->min_pu_height) {
        mpp_log("min_pu_height diff\n");
        return -1;
    }

    if (openhevc_sps->qp_bd_offset != sps->qp_bd_offset) {
        mpp_log("qp_bd_offset diff \n");
        return -1;
    }
    return 0;
}